

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void mtranspose(double *sig,int rows,int cols,double *col)

{
  int block;
  double *col_local;
  int cols_local;
  int rows_local;
  double *sig_local;
  
  if ((rows < 0x400) || (cols < 0x400)) {
    stranspose(sig,rows,cols,col);
  }
  else {
    ctranspose(sig,rows,cols,col);
  }
  return;
}

Assistant:

void mtranspose(double *sig, int rows, int cols,double *col) {
	int block;
	
	block = (int) BLOCKSIZE * 16;

	if (rows >= block && cols >= block)  {
		ctranspose(sig,rows,cols,col);
	} else {
		stranspose(sig,rows,cols,col);
	}
}